

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandExtract(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nMultiSize;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  uint fAnd;
  int iVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fAnd = 0;
  Extra_UtilGetoptReset();
  nMultiSize = 3;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"Kavh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else if (pAVar2->ntkType == ABC_NTK_STRASH) {
          pAVar2 = Abc_NtkShareXor(pAVar2,nMultiSize,fAnd,fVerbose);
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          pcVar3 = "Cascade synthesis has failed.\n";
        }
        else {
          pcVar3 = "Can only collapse a logic network or an AIG.\n";
        }
        iVar4 = -1;
        goto LAB_002546eb;
      }
      if (iVar1 != 0x61) break;
      fAnd = fAnd ^ 1;
    }
    if (iVar1 != 0x4b) goto LAB_00254655;
    if (argc <= globalUtilOptind) break;
    nMultiSize = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)nMultiSize < 0) {
LAB_00254655:
      Abc_Print(-2,"usage: extract [-K <num>] [-avh]\n");
      Abc_Print(-2,"\t           extracts shared logic from multi-input gates\n");
      Abc_Print(-2,"\t-K <num> : the minimum gate size to consider for extraction [default = %d]\n",
                (ulong)nMultiSize);
      pcVar3 = "AND";
      if (fAnd == 0) {
        pcVar3 = "XOR";
      }
      Abc_Print(-2,"\t-a       : toggle multi-input XOR vs multi-input AND [default = %s]\n",pcVar3)
      ;
      pcVar3 = "yes";
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar3);
      pcVar3 = "\t-h       : print the command usage\n";
      iVar4 = -2;
LAB_002546eb:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
  goto LAB_00254655;
}

Assistant:

int Abc_CommandExtract( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkShareXor( Abc_Ntk_t * pNtk, int nMultiSize, int fAnd, int fVerbose );
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nMultiSize, fAnd, fVerbose;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    nMultiSize = 3;
    fAnd       = 0;
    fVerbose   = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nMultiSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMultiSize < 0 )
                goto usage;
            break;
        case 'a':
            fAnd ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Can only collapse a logic network or an AIG.\n" );
        return 1;
    }
    // get the new network
    pNtkRes = Abc_NtkShareXor( pNtk, nMultiSize, fAnd, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Cascade synthesis has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: extract [-K <num>] [-avh]\n" );
    Abc_Print( -2, "\t           extracts shared logic from multi-input gates\n" );
    Abc_Print( -2, "\t-K <num> : the minimum gate size to consider for extraction [default = %d]\n", nMultiSize );
    Abc_Print( -2, "\t-a       : toggle multi-input XOR vs multi-input AND [default = %s]\n", fAnd? "AND": "XOR" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}